

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::renderLoop
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,LoopTag *tag,
          SizeT *offset)

{
  StringView<char> *key;
  uint uVar1;
  TagBit *tag_00;
  LoopItem *pLVar2;
  bool bVar3;
  byte bVar4;
  SizeT offset_00;
  SizeT SVar5;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar6;
  Value<char> *pVVar7;
  size_t in_RCX;
  SizeT index;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *groupedValue;
  Value<char> grouped_set;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_68;
  undefined1 local_58;
  LoopItem local_48;
  
  local_58 = 0;
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  StringStream<char>::write
            (this->stream_,*offset + (int)this->content_,(void *)(ulong)(tag->Offset - *offset),
             in_RCX);
  *offset = tag->EndOffset + 7;
  if ((tag->Set).Length == 0) {
    paVar6 = &this->value_->field_0;
  }
  else {
    paVar6 = &getValue(this,&tag->Set)->field_0;
  }
  if (paVar6 != (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)0x0) {
    groupedValue = paVar6;
    if (tag->GroupLength != 0) {
      groupedValue = &local_68;
      bVar3 = Value<char>::GroupBy
                        ((Value<char> *)&paVar6->array_,(Value<char> *)&groupedValue->array_,
                         this->content_ + (ulong)tag->GroupOffset + (ulong)tag->Offset,
                         (uint)tag->GroupLength);
      if (!bVar3) goto LAB_001107da;
    }
    bVar4 = tag->Options;
    paVar6 = groupedValue;
    if (1 < bVar4) {
      if (tag->GroupLength == '\0') {
        paVar6 = &local_68;
        Value<char>::operator=((Value<char> *)&paVar6->array_,(Value<char> *)&groupedValue->array_);
        bVar4 = tag->Options;
      }
      Value<char>::Sort((Value<char> *)&local_68.array_,(bool)((bVar4 & 2) >> 1));
    }
    tag_00 = (tag->SubTags).storage_;
    uVar1 = (tag->SubTags).index_;
    offset_00 = (uint)tag->ContentOffset + tag->Offset;
    SVar5 = Value<char>::Size((Value<char> *)&paVar6->array_);
    if (this->loops_items_->index_ <= (uint)tag->Level) {
      local_48.Key.length_ = 0;
      local_48.Key._12_4_ = 0;
      local_48.Value = (Value<char> *)0x0;
      local_48.Key.storage_ = (char *)0x0;
      Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
      ::operator+=(this->loops_items_,&local_48);
    }
    bVar3 = Value<char>::IsObject((Value<char> *)&paVar6->array_);
    index = 0;
    if (bVar3) {
      for (; SVar5 != index; index = index + 1) {
        pLVar2 = this->loops_items_->storage_;
        key = &pLVar2[tag->Level].Key;
        Value<char>::SetValueAndKey
                  ((Value<char> *)&paVar6->array_,index,&pLVar2[tag->Level].Value,key);
        if (*(long *)((long)(key + -1) + 8) != 0) {
          render(this,tag_00,tag_00 + uVar1,offset_00,tag->EndOffset);
        }
      }
    }
    else {
      for (; SVar5 != index; index = index + 1) {
        pLVar2 = this->loops_items_->storage_;
        bVar4 = tag->Level;
        pVVar7 = Value<char>::GetValue((Value<char> *)&paVar6->array_,index);
        pLVar2[bVar4].Value = pVVar7;
        if (pVVar7 != (Value<char> *)0x0) {
          render(this,tag_00,tag_00 + uVar1,offset_00,tag->EndOffset);
        }
      }
    }
  }
LAB_001107da:
  Value<char>::~Value((Value<char> *)&local_68.array_);
  return;
}

Assistant:

void renderLoop(const LoopTag &tag, SizeT &offset) const {
        Value_T        grouped_set;
        const Value_T *loop_set;

        stream_->Write((content_ + offset), (tag.Offset - offset));
        offset = tag.EndOffset;
        offset += TagPatterns::LoopSuffixLength;

        // Set (Array|Object)
        if (tag.Set.Length != 0) {
            loop_set = getValue(tag.Set);
        } else {
            loop_set = value_;
        }

        if (loop_set != nullptr) {
            // Group
            if (tag.GroupLength != 0) {
                if (!(loop_set->GroupBy(grouped_set, (content_ + tag.Offset + tag.GroupOffset), tag.GroupLength))) {
                    return;
                }

                loop_set = &grouped_set;
            }

            // Sort
            if (tag.Options > SizeT8{1}) {
                if (tag.GroupLength == 0) {
                    grouped_set = *loop_set;
                    loop_set    = &grouped_set;
                }

                grouped_set.Sort((tag.Options & LoopTagOptions::SortAscend) == LoopTagOptions::SortAscend);
            }

            // Stage 4: Render
            const TagBit *s_tag          = tag.SubTags.First();
            const TagBit *s_end          = (s_tag + tag.SubTags.Size());
            const SizeT   content_offset = (tag.Offset + tag.ContentOffset);
            const SizeT   loop_size      = loop_set->Size();
            SizeT         loop_index     = 0;

            if (loops_items_->Size() <= tag.Level) {
                *loops_items_ += LoopItem{};
            }

            if (loop_set->IsObject()) {
                while (loop_index < loop_size) {
                    LoopItem &item = loops_items_->Storage()[tag.Level];
                    loop_set->SetValueAndKey(loop_index, item.Value, item.Key);

                    if (item.Value != nullptr) {
                        render(s_tag, s_end, content_offset, tag.EndOffset);
                    }

                    ++loop_index;
                }
            } else {
                while (loop_index < loop_size) {
                    LoopItem &item = loops_items_->Storage()[tag.Level];
                    item.Value     = loop_set->GetValue(loop_index);

                    if (item.Value != nullptr) {
                        render(s_tag, s_end, content_offset, tag.EndOffset);
                    }

                    ++loop_index;
                }
            }
        }
    }